

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::initTexture(ShaderTextureFunctionCase *this)

{
  pointer *ppTVar1;
  Function FVar2;
  TextureType TVar3;
  int iVar4;
  WrapMode WVar5;
  int i;
  int iVar6;
  int iVar7;
  long lVar8;
  Texture2D *this_00;
  long lVar9;
  TextureCube *this_01;
  int i_6;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  TextureBinding *pTVar14;
  iterator __position;
  int face;
  IVec4 *pIVar15;
  byte bVar16;
  float fVar17;
  CubeFaceFloatCoords CVar18;
  CubeFaceFloatCoords CVar19;
  CubeFaceFloatCoords CVar20;
  Vec2 f;
  Vector<float,_4> res_3;
  Vector<float,_4> res_9;
  IVec2 viewportSize;
  Vec4 colorB;
  Vec4 cScale;
  Vec4 cBias;
  Vec4 colorA;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  float local_140 [2];
  Vec4 local_138;
  float local_128 [6];
  undefined1 local_110 [8];
  TestContext *local_108;
  _Alloc_hider _Stack_100;
  float local_f8 [2];
  undefined1 auStack_f0 [16];
  _Alloc_hider _Stack_e0;
  float local_d8 [2];
  undefined1 local_d0 [8];
  TextureBinding local_c8;
  undefined1 local_78 [16];
  float afStack_68 [6];
  _Alloc_hider _Stack_50;
  size_type local_48;
  undefined1 auStack_40 [16];
  
  bVar16 = 0;
  if (initTexture()::texCubeSwz == '\0') {
    initTexture();
  }
  auStack_40._8_8_ =
       glu::mapGLTransferFormat((this->m_textureSpec).format,(this->m_textureSpec).dataType);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_78,(TextureFormat *)(auStack_40 + 8));
  deqp::gls::ShaderRenderCase::getViewportSize((ShaderRenderCase *)local_110);
  FVar2 = (this->m_lookupSpec).function;
  fVar17 = 1.0;
  if ((FVar2 < FUNCTION_LAST) && ((0x36U >> (FVar2 & 0x1f) & 1) != 0)) {
    fVar17 = 1.0 / (this->m_lookupSpec).minCoord.m_data[FVar2 == FUNCTION_TEXTUREPROJ3 ^ 3];
  }
  TVar3 = (this->m_textureSpec).type;
  if (TVar3 == TEXTURETYPE_CUBE_MAP) {
    iVar6 = (this->m_textureSpec).numLevels + -1;
    iVar10 = 1;
    if (1 < iVar6) {
      iVar10 = iVar6;
    }
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    auStack_f0._0_8_ = 0;
    lVar8 = 0;
    do {
      local_f8[lVar8] = afStack_68[lVar8] - *(float *)(local_78 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    auStack_f0._8_8_ = local_78._0_8_;
    _Stack_e0._M_p = (pointer)local_78._8_8_;
    iVar6 = (this->m_textureSpec).width;
    iVar12 = (this->m_textureSpec).height;
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    iVar13 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar13 = iVar12;
    }
    iVar12 = iVar13 >> 2;
    if (iVar7 >> 2 < iVar13 >> 2) {
      iVar12 = iVar7 >> 2;
    }
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube
              (this_01,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar6);
    this->m_textureCube = this_01;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar8 = 0;
      do {
        local_140[0] = (float)(int)lVar8 * (1.0 / (float)iVar10);
        local_140[1] = 1.0 - local_140[0];
        iVar6 = iVar12 >> ((byte)lVar8 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        pIVar15 = initTexture::texCubeSwz;
        lVar9 = 0;
        do {
          local_c8.m_type = TYPE_NONE;
          local_c8.m_sampler.wrapS = CLAMP_TO_EDGE;
          local_c8.m_sampler.wrapT = CLAMP_TO_EDGE;
          local_c8.m_sampler.wrapR = CLAMP_TO_EDGE;
          lVar11 = 0;
          do {
            (&local_c8.m_type)[lVar11] = TYPE_2D - pIVar15->m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_128[1] = local_140[initTexture::texCubeSwz[lVar9].m_data[1]];
          local_128[0] = local_140[initTexture::texCubeSwz[lVar9].m_data[0]];
          local_128[3] = local_140[initTexture::texCubeSwz[lVar9].m_data[3]];
          local_128[2] = local_140[initTexture::texCubeSwz[lVar9].m_data[2]];
          local_138.m_data[0] = 0.0;
          local_138.m_data[1] = 0.0;
          local_138.m_data[2] = 0.0;
          local_138.m_data[3] = 0.0;
          lVar11 = 0;
          do {
            local_138.m_data[lVar11] = local_f8[lVar11] * local_128[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_108 = (TestContext *)0x0;
          _Stack_100._M_p = (pointer)0x0;
          lVar11 = 0;
          do {
            *(float *)((long)&local_108 + lVar11 * 4) =
                 *(float *)(auStack_f0 + lVar11 * 4 + 8) + local_138.m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_d8[0] = local_140[(int)local_c8.m_type];
          local_d8[1] = local_140[(int)local_c8.m_sampler.wrapS];
          local_d0._0_4_ = local_140[(int)local_c8.m_sampler.wrapT];
          local_d0._4_4_ = local_140[(int)local_c8.m_sampler.wrapR];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          local_128[3] = 0.0;
          lVar11 = 0;
          do {
            local_128[lVar11] = local_f8[lVar11] * local_d8[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          local_138.m_data[0] = 0.0;
          local_138.m_data[1] = 0.0;
          local_138.m_data[2] = 0.0;
          local_138.m_data[3] = 0.0;
          lVar11 = 0;
          do {
            local_138.m_data[lVar11] = *(float *)(auStack_f0 + lVar11 * 4 + 8) + local_128[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          tcu::TextureCube::allocLevel
                    (&this->m_textureCube->m_refTexture,(CubeFace)lVar9,(int)lVar8);
          tcu::fillWithGrid((this->m_textureCube->m_refTexture).m_access[lVar9].
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar8,iVar6,
                            (Vec4 *)&local_108,&local_138);
          lVar9 = lVar9 + 1;
          pIVar15 = pIVar15 + 1;
        } while (lVar9 != 6);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->m_textureSpec).numLevels);
    }
    glu::TextureCube::upload(this->m_textureCube);
    local_c8.m_sampler.wrapS = (WrapMode)((this->m_lookupSpec).minCoord.m_data[1] * fVar17);
    local_c8.m_type = (Type)((this->m_lookupSpec).minCoord.m_data[0] * fVar17);
    local_c8.m_sampler.wrapT = (WrapMode)((this->m_lookupSpec).minCoord.m_data[2] * fVar17);
    CVar18 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    local_c8.m_sampler.wrapT = (WrapMode)((this->m_lookupSpec).minCoord.m_data[2] * fVar17);
    local_c8.m_sampler.wrapS = (WrapMode)((this->m_lookupSpec).minCoord.m_data[1] * fVar17);
    local_c8.m_type = (Type)((this->m_lookupSpec).maxCoord.m_data[0] * fVar17);
    CVar19 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    local_c8.m_sampler.wrapS = (WrapMode)((this->m_lookupSpec).maxCoord.m_data[1] * fVar17);
    local_c8.m_type = (Type)((this->m_lookupSpec).minCoord.m_data[0] * fVar17);
    local_c8.m_sampler.wrapT = (WrapMode)(fVar17 * (this->m_lookupSpec).minCoord.m_data[2]);
    CVar20 = tcu::getCubeFaceCoords((Vec3 *)&local_c8);
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width * (CVar19.s - CVar18.s)) /
                        (float)(int)local_110._0_4_,0.0,0.0,
                        ((float)(this->m_textureSpec).height * (CVar20.t - CVar18.t)) /
                        (float)(int)local_110._4_4_);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              (&local_c8,this->m_textureCube,&(this->m_textureSpec).sampler);
  }
  else {
    if (TVar3 != TEXTURETYPE_2D) goto LAB_00f41c40;
    iVar6 = (this->m_textureSpec).numLevels + -1;
    iVar10 = 1;
    if (1 < iVar6) {
      iVar10 = iVar6;
    }
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    auStack_f0._0_8_ = 0;
    lVar8 = 0;
    do {
      local_f8[lVar8] = afStack_68[lVar8] - *(float *)(local_78 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    auStack_f0._8_8_ = local_78._0_8_;
    _Stack_e0._M_p = (pointer)local_78._8_8_;
    iVar6 = (this->m_textureSpec).width;
    iVar12 = (this->m_textureSpec).height;
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    iVar13 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar13 = iVar12;
    }
    iVar4 = iVar13 >> 2;
    if (iVar7 >> 2 < iVar13 >> 2) {
      iVar4 = iVar7 >> 2;
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderRenderCase).m_renderCtx,(this->m_textureSpec).format,
               (this->m_textureSpec).dataType,iVar6,iVar12);
    this->m_texture2D = this_00;
    if (0 < (this->m_textureSpec).numLevels) {
      lVar8 = 0;
      do {
        local_138.m_data[0] = (float)(int)lVar8 * (1.0 / (float)iVar10);
        local_138.m_data[1] = 1.0 - local_138.m_data[0];
        local_138.m_data[3] = local_138.m_data[1];
        local_138.m_data[2] = local_138.m_data[0];
        local_108 = (TestContext *)0x0;
        _Stack_100._M_p = (pointer)0x0;
        lVar9 = 0;
        do {
          *(float *)((long)&local_108 + lVar9 * 4) = local_f8[lVar9] * local_138.m_data[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_c8.m_type = TYPE_NONE;
        local_c8.m_sampler.wrapS = CLAMP_TO_EDGE;
        local_c8.m_sampler.wrapT = CLAMP_TO_EDGE;
        local_c8.m_sampler.wrapR = CLAMP_TO_EDGE;
        lVar9 = 0;
        do {
          (&local_c8.m_type)[lVar9] =
               (Type)(*(float *)(auStack_f0 + lVar9 * 4 + 8) +
                     *(float *)((long)&local_108 + lVar9 * 4));
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_128[1] = local_138.m_data[0];
        local_128[0] = local_138.m_data[1];
        local_128[3] = local_138.m_data[0];
        local_128[2] = local_138.m_data[1];
        local_138.m_data[0] = 0.0;
        local_138.m_data[1] = 0.0;
        local_138.m_data[2] = 0.0;
        local_138.m_data[3] = 0.0;
        lVar9 = 0;
        do {
          local_138.m_data[lVar9] = local_f8[lVar9] * local_128[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_108 = (TestContext *)0x0;
        _Stack_100._M_p = (pointer)0x0;
        lVar9 = 0;
        do {
          *(float *)((long)&local_108 + lVar9 * 4) =
               *(float *)(auStack_f0 + lVar9 * 4 + 8) + local_138.m_data[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        tcu::Texture2D::allocLevel(&this->m_texture2D->m_refTexture,(int)lVar8);
        iVar6 = iVar4 >> ((byte)lVar8 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        tcu::fillWithGrid((this->m_texture2D->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar8,iVar6,(Vec4 *)&local_c8,
                          (Vec4 *)&local_108);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->m_textureSpec).numLevels);
    }
    (*this->m_texture2D->_vptr_Texture2D[2])();
    fVar17 = glu::TextureTestUtil::computeLodFromDerivates
                       (LODMODE_EXACT,
                        ((float)(this->m_textureSpec).width *
                        ((this->m_lookupSpec).maxCoord.m_data[0] -
                        (this->m_lookupSpec).minCoord.m_data[0]) * fVar17) /
                        (float)(int)local_110._0_4_,0.0,0.0,
                        ((float)(this->m_textureSpec).height *
                        ((this->m_lookupSpec).maxCoord.m_data[1] -
                        (this->m_lookupSpec).minCoord.m_data[1]) * fVar17) /
                        (float)(int)local_110._4_4_);
    (this->m_lookupParams).lod = fVar17;
    deqp::gls::TextureBinding::TextureBinding
              (&local_c8,this->m_texture2D,&(this->m_textureSpec).sampler);
  }
  __position._M_current =
       (this->super_ShaderRenderCase).m_textures.
       super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_ShaderRenderCase).m_textures.
      super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
    _M_realloc_insert<deqp::gls::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,__position,&local_c8);
  }
  else {
    pTVar14 = &local_c8;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      WVar5 = (pTVar14->m_sampler).wrapS;
      (__position._M_current)->m_type = pTVar14->m_type;
      ((__position._M_current)->m_sampler).wrapS = WVar5;
      pTVar14 = (TextureBinding *)((long)pTVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      __position._M_current = __position._M_current + (ulong)bVar16 * -0x10 + 8;
    }
    ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
               super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
LAB_00f41c40:
  *(undefined8 *)(this->m_lookupParams).scale.m_data = afStack_68._16_8_;
  *(pointer *)((this->m_lookupParams).scale.m_data + 2) = _Stack_50._M_p;
  *(size_type *)(this->m_lookupParams).bias.m_data = local_48;
  *(undefined8 *)((this->m_lookupParams).bias.m_data + 2) = auStack_40._0_8_;
  return;
}

Assistant:

void ShaderTextureFunctionCase::initTexture (void)
{
	static const IVec4 texCubeSwz[] =
	{
		IVec4(0,0,1,1),
		IVec4(1,1,0,0),
		IVec4(0,1,0,1),
		IVec4(1,0,1,0),
		IVec4(0,1,1,0),
		IVec4(1,0,0,1)
	};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(texCubeSwz) == tcu::CUBEFACE_LAST);

	tcu::TextureFormat		texFmt			= glu::mapGLTransferFormat(m_textureSpec.format, m_textureSpec.dataType);
	tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	tcu::IVec2				viewportSize	= getViewportSize();
	bool					isProj			= functionHasProj(m_lookupSpec.function);
	float					proj			= isProj ? 1.0f/m_lookupSpec.minCoord[m_lookupSpec.function == FUNCTION_TEXTUREPROJ3 ? 2 : 3] : 1.0f;

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			m_texture2D = new glu::Texture2D(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width, m_textureSpec.height);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec4	colorA	= cBias + cScale*Vec4(fA, fB, fA, fB);
				Vec4	colorB	= cBias + cScale*Vec4(fB, fA, fB, fA);

				m_texture2D->getRefTexture().allocLevel(level);
				tcu::fillWithGrid(m_texture2D->getRefTexture().getLevel(level), de::max(1, baseCellSize>>level), colorA, colorB);
			}
			m_texture2D->upload();

			// Compute LOD.
			float dudx = (m_lookupSpec.maxCoord[0]-m_lookupSpec.minCoord[0])*proj*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float dvdy = (m_lookupSpec.maxCoord[1]-m_lookupSpec.minCoord[1])*proj*(float)m_textureSpec.height	/ (float)viewportSize[1];
			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			// Append to texture list.
			m_textures.push_back(gls::TextureBinding(m_texture2D, m_textureSpec.sampler));
			break;
		}

		case TEXTURETYPE_CUBE_MAP:
		{
			float	cStep			= 1.0f / (float)de::max(1, m_textureSpec.numLevels-1);
			Vec4	cScale			= fmtInfo.valueMax-fmtInfo.valueMin;
			Vec4	cBias			= fmtInfo.valueMin;
			int		baseCellSize	= de::min(m_textureSpec.width/4, m_textureSpec.height/4);

			DE_ASSERT(m_textureSpec.width == m_textureSpec.height);
			m_textureCube = new glu::TextureCube(m_renderCtx, m_textureSpec.format, m_textureSpec.dataType, m_textureSpec.width);
			for (int level = 0; level < m_textureSpec.numLevels; level++)
			{
				float	fA		= float(level)*cStep;
				float	fB		= 1.0f-fA;
				Vec2	f		(fA, fB);

				for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				{
					const IVec4&	swzA	= texCubeSwz[face];
					IVec4			swzB	= 1-swzA;
					Vec4			colorA	= cBias + cScale*f.swizzle(swzA[0], swzA[1], swzA[2], swzA[3]);
					Vec4			colorB	= cBias + cScale*f.swizzle(swzB[0], swzB[1], swzB[2], swzB[3]);

					m_textureCube->getRefTexture().allocLevel((tcu::CubeFace)face, level);
					tcu::fillWithGrid(m_textureCube->getRefTexture().getLevelFace(level, (tcu::CubeFace)face), de::max(1, baseCellSize>>level), colorA, colorB);
				}
			}
			m_textureCube->upload();

			// Compute LOD \note Assumes that only single side is accessed and R is constant major axis.
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[2] - m_lookupSpec.maxCoord[2]) < 0.005);
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[0]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[0]) < de::abs(m_lookupSpec.minCoord[2]));
			DE_ASSERT(de::abs(m_lookupSpec.minCoord[1]) < de::abs(m_lookupSpec.minCoord[2]) && de::abs(m_lookupSpec.maxCoord[1]) < de::abs(m_lookupSpec.minCoord[2]));

			tcu::CubeFaceFloatCoords	c00		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c10		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.maxCoord[0]*proj, m_lookupSpec.minCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			tcu::CubeFaceFloatCoords	c01		= tcu::getCubeFaceCoords(Vec3(m_lookupSpec.minCoord[0]*proj, m_lookupSpec.maxCoord[1]*proj, m_lookupSpec.minCoord[2]*proj));
			float						dudx	= (c10.s - c00.s)*(float)m_textureSpec.width	/ (float)viewportSize[0];
			float						dvdy	= (c01.t - c00.t)*(float)m_textureSpec.height	/ (float)viewportSize[1];

			m_lookupParams.lod = glu::TextureTestUtil::computeLodFromDerivates(glu::TextureTestUtil::LODMODE_EXACT, dudx, 0.0f, 0.0f, dvdy);

			m_textures.push_back(gls::TextureBinding(m_textureCube, m_textureSpec.sampler));
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Set lookup scale & bias
	m_lookupParams.scale	= fmtInfo.lookupScale;
	m_lookupParams.bias		= fmtInfo.lookupBias;
}